

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcProperty *in;
  
  in = (IfcProperty *)operator_new(0x70);
  *(undefined8 *)&in->field_0x60 = 0;
  *(char **)&in->field_0x68 = "IfcProperty";
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcProperty_008dd0d8;
  *(undefined ***)&in->field_0x58 = &PTR__IfcProperty_008dd100;
  *(undefined1 **)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).field_0x10 =
       &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).field_0x20;
  *(undefined8 *)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).field_0x18 = 0
  ;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).field_0x20 = 0;
  (in->Description).ptr._M_dataplus._M_p = (pointer)&(in->Description).ptr.field_2;
  (in->Description).ptr._M_string_length = 0;
  (in->Description).ptr.field_2._M_local_buf[0] = '\0';
  (in->Description).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcProperty>(db,params,in);
  return (Object *)
         ((long)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                 _vptr_ObjectHelper +
         (long)(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }